

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  allocator<void> allocator;
  ptr p;
  binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
  function;
  allocator<void> local_61;
  ptr local_60;
  _Any_data local_48;
  _func_void_impl_base_ptr_bool *local_38;
  _func_void_impl_base_ptr_bool *local_30;
  _func_void_impl_base_ptr_bool *local_28;
  _func_void_impl_base_ptr_bool *p_Stack_20;
  _func_void_impl_base_ptr_bool *local_18;
  
  local_60.a = &local_61;
  local_48._M_unused._M_object = (_func_void_impl_base_ptr_bool *)0x0;
  local_48._8_8_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_38 = (_func_void_impl_base_ptr_bool *)0x0;
  local_30 = base[4].complete_;
  p_Var1 = base[3].complete_;
  if (p_Var1 != (_func_void_impl_base_ptr_bool *)0x0) {
    local_48._M_unused._M_object = base[1].complete_;
    local_48._8_8_ = base[2].complete_;
    base[3].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    base[4].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
    local_38 = p_Var1;
  }
  local_28 = base[5].complete_;
  p_Stack_20 = base[6].complete_;
  local_18 = base[7].complete_;
  local_60.v = base;
  local_60.p = (impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::reset(&local_60);
  if (call) {
    binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
    ::operator()((binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
                  *)&local_48);
    p_Var1 = local_38;
  }
  if (p_Var1 != (_func_void_impl_base_ptr_bool *)0x0) {
    (*p_Var1)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  impl<asio::detail::binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::reset(&local_60);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }